

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::remapNonEntryPointIO(HlslParseContext *this,TFunction *function)

{
  int iVar1;
  undefined4 extraout_var;
  HlslParseContext *pHVar2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TType *pTVar3;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar4;
  undefined4 extraout_var_00;
  
  iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if (iVar1 != 0) {
    iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    pHVar2 = (HlslParseContext *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*(pHVar2->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
    clearUniformInputOutput(pHVar2,(TQualifier *)CONCAT44(extraout_var_01,iVar1));
  }
  iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar1) {
    uVar4 = 0;
    do {
      pHVar2 = (HlslParseContext *)function;
      iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar4);
      pTVar3 = getStructBufferContentType(pHVar2,*(TType **)(CONCAT44(extraout_var_02,iVar1) + 8));
      if (pTVar3 == (TType *)0x0) {
        iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar4);
        pHVar2 = *(HlslParseContext **)(CONCAT44(extraout_var_03,iVar1) + 8);
        iVar1 = (*(pHVar2->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])()
        ;
        clearUniformInputOutput(pHVar2,(TQualifier *)CONCAT44(extraout_var_04,iVar1));
      }
      uVar4 = uVar4 + 1;
      iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar4 < iVar1);
  }
  return;
}

Assistant:

void HlslParseContext::remapNonEntryPointIO(TFunction& function)
{
    // return value
    if (function.getType().getBasicType() != EbtVoid)
        clearUniformInputOutput(function.getWritableType().getQualifier());

    // parameters.
    // References to structuredbuffer types are left unmodified
    for (int i = 0; i < function.getParamCount(); i++)
        if (!isReference(*function[i].type))
            clearUniformInputOutput(function[i].type->getQualifier());
}